

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * anon_unknown.dwarf_233176::CreateLogicalNot
                    (VmModule *module,SynBase *source,VmValue *value)

{
  VmValueType VVar1;
  uint uVar2;
  VmInstruction *pVVar3;
  VmValue *in_stack_fffffffffffffff8;
  
  VVar1 = (value->type).type;
  uVar2 = (value->type).size;
  if (((uVar2 != 4 || VVar1 != VM_TYPE_INT) && (VVar1 != VM_TYPE_POINTER)) &&
     (uVar2 != 8 || VVar1 != VM_TYPE_LONG)) {
    __assert_fail("value->type == VmType::Int || value->type == VmType::Long || value->type.type == VM_TYPE_POINTER"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x2c2,
                  "VmValue *(anonymous namespace)::CreateLogicalNot(VmModule *, SynBase *, VmValue *)"
                 );
  }
  pVVar3 = CreateInstruction((anon_unknown_dwarf_233176 *)module,(VmModule *)source,
                             (SynBase *)0x400000001,(VmType)(ZEXT816(0x46) << 0x40),
                             (VmInstructionType)value,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                             (VmValue *)0x0,in_stack_fffffffffffffff8);
  return &pVVar3->super_VmValue;
}

Assistant:

VmValue* CreateLogicalNot(VmModule *module, SynBase *source, VmValue *value)
	{
		assert(value->type == VmType::Int || value->type == VmType::Long || value->type.type == VM_TYPE_POINTER);

		return CreateInstruction(module, source, VmType::Int, VM_INST_LOG_NOT, value);
	}